

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLNodeLoader.cpp
# Opt level: O3

bool __thiscall COLLADASaxFWL::NodeLoader::end__instance_controller(NodeLoader *this)

{
  IFilePartLoader::
  copyStlContainerToArray<std::set<COLLADAFW::MaterialBinding,std::less<COLLADAFW::MaterialBinding>,std::allocator<COLLADAFW::MaterialBinding>>,COLLADAFW::Array<COLLADAFW::MaterialBinding>>
            (&this->mCurrentMaterialBindings,&this->mCurrentInstanceController->mMaterialBindings);
  this->mCurrentInstanceController = (InstanceController *)0x0;
  this->mCurrentMaterialInfo = (GeometryMaterialIdInfo *)0x0;
  this->mCurrentInstanceControllerData = (InstanceControllerData *)0x0;
  std::
  _Rb_tree<COLLADAFW::MaterialBinding,_COLLADAFW::MaterialBinding,_std::_Identity<COLLADAFW::MaterialBinding>,_std::less<COLLADAFW::MaterialBinding>,_std::allocator<COLLADAFW::MaterialBinding>_>
  ::clear(&(this->mCurrentMaterialBindings)._M_t);
  return true;
}

Assistant:

bool NodeLoader::end__instance_controller()
	{
        FilePartLoader::copyStlContainerToArray( mCurrentMaterialBindings, mCurrentInstanceController->getMaterialBindings());
        mCurrentInstanceController = 0;
		mCurrentInstanceControllerData = 0;
        endInstanceWithMaterial();

		return true;
	}